

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

Option * __thiscall
kj::MainBuilder::Impl::addOption
          (Impl *this,initializer_list<kj::MainBuilder::OptionName> names,bool hasArg,
          StringPtr helpText)

{
  undefined7 uVar1;
  const_iterator pOVar2;
  size_type sVar3;
  OptionName *pOVar4;
  ulong index;
  __enable_if_t<is_constructible<value_type,_pair<ArrayPtr<const_char>,_Option_*>_>::value,_pair<iterator,_bool>_>
  _Var5;
  pair<char,_kj::MainBuilder::Impl::Option_*> pVar6;
  __enable_if_t<is_constructible<value_type,_pair<char,_Option_*>_>::value,_pair<iterator,_bool>_>
  _Var7;
  Fault local_138;
  Fault f_2;
  Option *local_120;
  pair<char,_kj::MainBuilder::Impl::Option_*> local_118;
  _Base_ptr local_108;
  undefined1 local_100;
  Fault local_f8;
  Fault f_1;
  Option *local_e0;
  StringPtr local_d8;
  ArrayPtr<const_char> local_c8;
  pair<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*> local_b8;
  _Base_ptr local_a0;
  undefined1 local_98;
  const_iterator local_90;
  OptionName *name;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<kj::MainBuilder::OptionName> *__range2;
  undefined1 auStack_68 [4];
  uint i;
  size_t local_60;
  Option *local_58;
  Option *option;
  Fault local_40;
  Fault f;
  bool hasArg_local;
  Impl *this_local;
  StringPtr helpText_local;
  initializer_list<kj::MainBuilder::OptionName> names_local;
  
  helpText_local.content.ptr = (char *)helpText.content.size_;
  helpText_local.content.size_ = (size_t)names._M_array;
  f.exception._7_1_ = hasArg;
  sVar3 = std::initializer_list<kj::MainBuilder::OptionName>::size
                    ((initializer_list<kj::MainBuilder::OptionName> *)&helpText_local.content.size_)
  ;
  if (sVar3 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,0x12e,FAILED,"names.size() > 0","\"option must have at least one name\"",
               (char (*) [35])"option must have at least one name");
    kj::_::Debug::Fault::fatal(&local_40);
  }
  local_58 = Arena::allocate<kj::MainBuilder::Impl::Option>(&this->arena);
  sVar3 = std::initializer_list<kj::MainBuilder::OptionName>::size
                    ((initializer_list<kj::MainBuilder::OptionName> *)&helpText_local.content.size_)
  ;
  _auStack_68 = Arena::allocateArray<kj::MainBuilder::OptionName>(&this->arena,sVar3);
  (local_58->names).ptr = _auStack_68;
  (local_58->names).size_ = local_60;
  __range2._4_4_ = 0;
  __begin2 = (const_iterator)&helpText_local.content.size_;
  __end2 = std::initializer_list<kj::MainBuilder::OptionName>::begin
                     ((initializer_list<kj::MainBuilder::OptionName> *)__begin2);
  name = std::initializer_list<kj::MainBuilder::OptionName>::end
                   ((initializer_list<kj::MainBuilder::OptionName> *)__begin2);
  do {
    pOVar2 = __end2;
    if (__end2 == name) {
      local_58->hasArg = (bool)(f.exception._7_1_ & 1);
      (local_58->helpText).content.ptr = helpText.content.ptr;
      (local_58->helpText).content.size_ = (size_t)helpText_local.content.ptr;
      return local_58;
    }
    local_90 = __end2;
    index = (ulong)__range2._4_4_;
    __range2._4_4_ = __range2._4_4_ + 1;
    pOVar4 = ArrayPtr<kj::MainBuilder::OptionName>::operator[](&local_58->names,index);
    uVar1 = *(undefined7 *)&pOVar2->field_0x1;
    pOVar4->isLong = pOVar2->isLong;
    *(undefined7 *)&pOVar4->field_0x1 = uVar1;
    pOVar4->field_1 = pOVar2->field_1;
    if ((local_90->isLong & 1U) == 0) {
      local_120 = local_58;
      pVar6 = std::make_pair<char_const&,kj::MainBuilder::Impl::Option*>
                        (&(local_90->field_1).shortName,&local_120);
      local_118.second = pVar6.second;
      local_118.first = pVar6.first;
      _Var7 = std::
              map<char,kj::MainBuilder::Impl::Option*,std::less<char>,std::allocator<std::pair<char_const,kj::MainBuilder::Impl::Option*>>>
              ::insert<std::pair<char,kj::MainBuilder::Impl::Option*>>
                        ((map<char,kj::MainBuilder::Impl::Option*,std::less<char>,std::allocator<std::pair<char_const,kj::MainBuilder::Impl::Option*>>>
                          *)&this->shortOptions,&local_118);
      f_2.exception = (Exception *)_Var7.first._M_node;
      local_100 = _Var7.second;
      local_108 = (_Base_ptr)f_2.exception;
      if (((undefined1  [16])_Var7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[17],char_const&>
                  (&local_138,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
                   ,0x13c,FAILED,
                   "shortOptions.insert(std::make_pair(name.shortName, &option)).second",
                   "\"duplicate option\", name.shortName",(char (*) [17])"duplicate option",
                   &(local_90->field_1).shortName);
        kj::_::Debug::Fault::fatal(&local_138);
      }
    }
    else {
      StringPtr::StringPtr(&local_d8,(local_90->field_1).longName);
      local_c8 = StringPtr::asArray(&local_d8);
      local_e0 = local_58;
      std::make_pair<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*>
                (&local_b8,&local_c8,&local_e0);
      _Var5 = std::
              map<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*,kj::MainBuilder::Impl::CharArrayCompare,std::allocator<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>>
              ::insert<std::pair<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*>>
                        ((map<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*,kj::MainBuilder::Impl::CharArrayCompare,std::allocator<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>>
                          *)&this->longOptions,&local_b8);
      f_1.exception = (Exception *)_Var5.first._M_node;
      local_98 = _Var5.second;
      local_a0 = (_Base_ptr)f_1.exception;
      if (((undefined1  [16])_Var5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[17],char_const*const&>
                  (&local_f8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
                   ,0x138,FAILED,
                   "longOptions.insert(std::make_pair(StringPtr(name.longName).asArray(), &option)).second"
                   ,"\"duplicate option\", name.longName",(char (*) [17])"duplicate option",
                   &(local_90->field_1).longName);
        kj::_::Debug::Fault::fatal(&local_f8);
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

Option& addOption(std::initializer_list<OptionName> names, bool hasArg, StringPtr helpText) {
    KJ_REQUIRE(names.size() > 0, "option must have at least one name");

    Option& option = arena.allocate<Option>();
    option.names = arena.allocateArray<OptionName>(names.size());
    uint i = 0;
    for (auto& name: names) {
      option.names[i++] = name;
      if (name.isLong) {
        KJ_REQUIRE(
            longOptions.insert(std::make_pair(StringPtr(name.longName).asArray(), &option)).second,
            "duplicate option", name.longName);
      } else {
        KJ_REQUIRE(
            shortOptions.insert(std::make_pair(name.shortName, &option)).second,
            "duplicate option", name.shortName);
      }
    }
    option.hasArg = hasArg;
    option.helpText = helpText;
    return option;
  }